

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<14,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Matrix<float,_4,_4> *mat;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res_3;
  Vector<float,_3> res;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Type in0;
  Vector<float,_3> res_1;
  float afStack_118 [2];
  undefined8 local_110;
  undefined4 local_108;
  Vec4 *local_100;
  ulong local_f8;
  undefined4 local_f0;
  float local_e4 [3];
  undefined8 local_d8;
  float local_d0;
  undefined8 local_cc;
  float local_c4;
  float local_c0 [4];
  float local_b0 [6];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Matrix<float,_4,_4> local_50;
  
  puVar3 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar3 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar6 != 4);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_90 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uVar2 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88 = (undefined4)uVar1;
    uStack_84 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_80 = (undefined4)uVar2;
    uStack_7c = (undefined4)((ulong)uVar2 >> 0x20);
    local_78 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
    mat = (Matrix<float,_4,_4> *)0x4;
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat4x4;
    mat = (Matrix<float,_4,_4> *)0x0;
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)puVar3 + lVar4 * 4) = *(undefined4 *)((long)puVar5 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      mat = (Matrix<float,_4,_4> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 4;
    } while (mat != (Matrix<float,_4,_4> *)0x4);
  }
  local_110 = local_98;
  local_108 = (undefined4)uStack_90;
  local_cc = CONCAT44(uStack_80,uStack_84);
  local_c4 = (float)uStack_7c;
  local_100 = (Vec4 *)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_100 + lVar4 * 4) =
         *(float *)((long)&local_110 + lVar4 * 4) + *(float *)((long)&local_cc + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8 = uStack_70;
  local_d0 = (float)(undefined4)local_78;
  local_50.m_data.m_data[0].m_data[0] = 0.0;
  local_50.m_data.m_data[0].m_data[1] = 0.0;
  local_50.m_data.m_data[0].m_data[2] = 0.0;
  lVar4 = 0;
  do {
    local_50.m_data.m_data[0].m_data[lVar4] =
         *(float *)((long)&local_100 + lVar4 * 4) + *(float *)((long)&local_d8 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e4[0] = uStack_60._4_4_;
  local_e4[1] = (float)local_68;
  local_e4[2] = (float)((ulong)local_68 >> 0x20);
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_b0[2] = 0.0;
  lVar4 = 0;
  do {
    local_b0[lVar4] = local_50.m_data.m_data[0].m_data[lVar4] + local_e4[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,4>
            (&local_50,(MatrixCaseUtils *)&local_98,mat);
  local_cc._0_4_ = local_50.m_data.m_data[0].m_data[0];
  local_cc._4_4_ = local_50.m_data.m_data[0].m_data[1];
  local_c4 = local_50.m_data.m_data[0].m_data[2];
  local_d8._0_4_ = local_50.m_data.m_data[1].m_data[1];
  local_d8._4_4_ = local_50.m_data.m_data[1].m_data[2];
  local_d0 = local_50.m_data.m_data[1].m_data[3];
  local_110 = 0;
  local_108 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_110 + lVar4 * 4) =
         *(float *)((long)&local_cc + lVar4 * 4) + *(float *)((long)&local_d8 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e4[0] = local_50.m_data.m_data[2].m_data[2];
  local_e4[1] = local_50.m_data.m_data[2].m_data[3];
  local_e4[2] = local_50.m_data.m_data[2].m_data[0];
  local_100 = (Vec4 *)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_100 + lVar4 * 4) =
         *(float *)((long)&local_110 + lVar4 * 4) + local_e4[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0[3] = local_50.m_data.m_data[3].m_data[3];
  local_b0[4] = local_50.m_data.m_data[3].m_data[0];
  local_b0[5] = local_50.m_data.m_data[3].m_data[1];
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4] = *(float *)((long)&local_100 + lVar4 * 4) + local_b0[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_110 = 0;
  local_108 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_110 + lVar4 * 4) = local_b0[lVar4] + local_c0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_100 = &evalCtx->color;
  local_f8 = 0x100000000;
  local_f0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_100 + lVar4 * 4)] = afStack_118[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}